

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O2

MockNamedValue * __thiscall MockSupport::retrieveDataFromStore(MockSupport *this,SimpleString *name)

{
  MockNamedValue *this_00;
  
  this_00 = MockNamedValueList::getValueByName(&this->data_,name);
  if (this_00 == (MockNamedValue *)0x0) {
    this_00 = (MockNamedValue *)
              operator_new(0x50,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockSupport.cpp"
                           ,0x167);
    MockNamedValue::MockNamedValue(this_00,name);
    MockNamedValueList::add(&this->data_,this_00);
  }
  return this_00;
}

Assistant:

MockNamedValue* MockSupport::retrieveDataFromStore(const SimpleString& name)
{
    MockNamedValue* newData = data_.getValueByName(name);
    if (newData == NULLPTR) {
        newData = new MockNamedValue(name);
        data_.add(newData);
    }
    return newData;
}